

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O2

subsequence_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::vector<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
* __thiscall
burst::make_subsequence_iterator<std::vector<int,std::allocator<int>>const&>
          (subsequence_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::vector<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
           *__return_storage_ptr__,burst *this,vector<int,_std::allocator<int>_> *range)

{
  subsequence_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::vector<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::subsequence_iterator
            (__return_storage_ptr__,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)*(int **)this,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             *(int **)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

auto make_subsequence_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subsequence_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }